

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O3

void duckdb::RLEFetchRow<double>
               (ColumnSegment *segment,ColumnFetchState *state,row_t row_id,Vector *result,
               idx_t result_idx)

{
  unsigned_long skip_count;
  RLEScanState<double> scan_state;
  RLEScanState<double> local_68;
  
  RLEScanState<double>::RLEScanState(&local_68,segment);
  skip_count = NumericCastImpl<unsigned_long,_long,_false>::Convert(row_id);
  RLEScanState<double>::Skip(&local_68,segment,skip_count);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_68.handle.node);
  *(undefined8 *)(result->data + result_idx * 8) =
       *(undefined8 *)
        ((local_68.handle.node.ptr)->buffer + local_68.entry_pos * 8 + segment->offset + 8);
  local_68.super_SegmentScanState._vptr_SegmentScanState = (_func_int **)&PTR__RLEScanState_0197afb0
  ;
  if ((_Head_base<0UL,_bool_*,_false>)
      local_68.matching_runs.super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
      super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
      super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
      super__Head_base<0UL,_bool_*,_false>._M_head_impl != (_Head_base<0UL,_bool_*,_false>)0x0) {
    operator_delete__((void *)local_68.matching_runs.
                              super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
                              super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
                              super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
                              super__Head_base<0UL,_bool_*,_false>._M_head_impl);
  }
  local_68.matching_runs.super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
  super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
  super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.super__Head_base<0UL,_bool_*,_false>.
  _M_head_impl = (unique_ptr<bool[],_std::default_delete<bool[]>_>)
                 (__uniq_ptr_data<bool,_std::default_delete<bool[]>,_true,_true>)0x0;
  BufferHandle::~BufferHandle(&local_68.handle);
  return;
}

Assistant:

void RLEFetchRow(ColumnSegment &segment, ColumnFetchState &state, row_t row_id, Vector &result, idx_t result_idx) {
	RLEScanState<T> scan_state(segment);
	scan_state.Skip(segment, NumericCast<idx_t>(row_id));

	auto data = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto data_pointer = reinterpret_cast<T *>(data + RLEConstants::RLE_HEADER_SIZE);
	auto result_data = FlatVector::GetData<T>(result);
	result_data[result_idx] = data_pointer[scan_state.entry_pos];
}